

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testMakeEmpty<short>(char *type)

{
  short sVar1;
  int iVar2;
  ostream *poVar3;
  char *in_RDI;
  bool bVar4;
  Interval<short> b_2;
  short max;
  short min;
  Interval<short> b_1;
  Interval<short> b;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Interval<short> local_1c;
  short local_18 [4];
  Interval<short> local_10;
  short local_c;
  short local_a;
  char *local_8;
  
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
  poVar3 = std::operator<<(poVar3,local_8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<short>::Interval((Interval<short> *)0x16aef2);
  Imath_3_2::Interval<short>::makeEmpty
            ((Interval<short> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  sVar1 = std::numeric_limits<short>::max();
  bVar4 = false;
  if (local_c == sVar1) {
    sVar1 = std::numeric_limits<short>::lowest();
    bVar4 = local_a == sVar1;
  }
  if (!bVar4) {
    __assert_fail("b.min == T (std::numeric_limits<T>::max ()) && b.max == T (std::numeric_limits<T>::lowest ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x55,"void (anonymous namespace)::testMakeEmpty(const char *) [T = short]");
  }
  local_18[3] = 0xffff;
  local_18[2] = 1;
  Imath_3_2::Interval<short>::Interval(&local_10,local_18 + 3,local_18 + 2);
  Imath_3_2::Interval<short>::makeEmpty
            ((Interval<short> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  sVar1 = std::numeric_limits<short>::max();
  bVar4 = false;
  if (local_10.min == sVar1) {
    sVar1 = std::numeric_limits<short>::lowest();
    bVar4 = local_10.max == sVar1;
  }
  if (!bVar4) {
    __assert_fail("b.min == T (std::numeric_limits<T>::max ()) && b.max == T (std::numeric_limits<T>::lowest ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x60,"void (anonymous namespace)::testMakeEmpty(const char *) [T = short]");
  }
  local_18[1] = 0;
  local_18[0] = 10;
  Imath_3_2::Interval<short>::Interval(&local_1c,local_18 + 1,local_18);
  Imath_3_2::Interval<short>::makeEmpty
            ((Interval<short> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  iVar2 = (int)local_1c.min;
  sVar1 = std::numeric_limits<short>::max();
  bVar4 = false;
  if (iVar2 == sVar1) {
    iVar2 = (int)local_1c.max;
    sVar1 = std::numeric_limits<short>::lowest();
    bVar4 = iVar2 == sVar1;
  }
  if (!bVar4) {
    __assert_fail("b.min == T (std::numeric_limits<T>::max ()) && b.max == T (std::numeric_limits<T>::lowest ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x6d,"void (anonymous namespace)::testMakeEmpty(const char *) [T = short]");
  }
  return;
}

Assistant:

void
testMakeEmpty (const char* type)
{
    cout << "    makeEmpty() for type " << type << endl;

    //
    // Empty interval
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        b.makeEmpty ();
        assert (
            b.min == T (std::numeric_limits<T>::max ()) &&
            b.max == T (std::numeric_limits<T>::lowest ()));
    }

    //
    // Non-empty, has volume
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b (T (-1), T (1));
        b.makeEmpty ();
        assert (
            b.min == T (std::numeric_limits<T>::max ()) &&
            b.max == T (std::numeric_limits<T>::lowest ()));
    }

    //
    // Non-empty, no volume
    //
    {
        T                                     min (0);
        T                                     max (10);
        IMATH_INTERNAL_NAMESPACE::Interval<T> b (min, max);
        b.makeEmpty ();
        assert (
            b.min == T (std::numeric_limits<T>::max ()) &&
            b.max == T (std::numeric_limits<T>::lowest ()));
    }
}